

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

void PrintIntro(void)

{
  printf("\n\nDemonstration program for ARKODE - SPGMR linear solver\n\n");
  printf("Food web problem with ns species, ns = %d\n",6);
  printf("Predator-prey interaction and diffusion on a 2-D square\n\n");
  printf("Matrix parameters: a = %.2g   e = %.2g   g = %.2g\n",0x3ff0000000000000,0x40c3880000000000
         ,0x3ea0c6f7a0b5ed8d);
  printf("b parameter = %.2g\n",0x3ff0000000000000);
  printf("Diffusion coefficients: Dprey = %.2g   Dpred = %.2g\n",0x3ff0000000000000,
         0x3fe0000000000000);
  printf("Rate parameter alpha = %.2g\n\n",0x3ff0000000000000);
  printf("Mesh dimensions (mx,my) are %d, %d.  ",6);
  printf("Total system size is neq = %d \n\n",0xd8);
  printf("Tolerances: reltol = %.2g, abstol = %.2g \n\n",&DAT_3ee4f8b588e368f1);
  printf("Preconditioning uses a product of:\n");
  printf("  (1) Gauss-Seidel iterations with ");
  printf("itmax = %d iterations, and\n",5);
  printf("  (2) interaction-only block-diagonal matrix ");
  printf("with block-grouping\n");
  printf("  Number of diagonal block groups = ngrp = %d",4);
  printf("  (ngx by ngy, ngx = %d, ngy = %d)\n",2);
  printf("\n\n--------------------------------------------------------------");
  printf("--------------\n");
  return;
}

Assistant:

static void PrintIntro(void)
{
  printf("\n\nDemonstration program for ARKODE - SPGMR linear solver\n\n");
  printf("Food web problem with ns species, ns = %d\n", NS);
  printf("Predator-prey interaction and diffusion on a 2-D square\n\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Matrix parameters: a = %.2Lg   e = %.2Lg   g = %.2Lg\n", AA, EE, GG);
  printf("b parameter = %.2Lg\n", BB);
  printf("Diffusion coefficients: Dprey = %.2Lg   Dpred = %.2Lg\n", DPREY, DPRED);
  printf("Rate parameter alpha = %.2Lg\n\n", ALPH);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Matrix parameters: a = %.2g   e = %.2g   g = %.2g\n", AA, EE, GG);
  printf("b parameter = %.2g\n", BB);
  printf("Diffusion coefficients: Dprey = %.2g   Dpred = %.2g\n", DPREY, DPRED);
  printf("Rate parameter alpha = %.2g\n\n", ALPH);
#else
  printf("Matrix parameters: a = %.2g   e = %.2g   g = %.2g\n", AA, EE, GG);
  printf("b parameter = %.2g\n", BB);
  printf("Diffusion coefficients: Dprey = %.2g   Dpred = %.2g\n", DPREY, DPRED);
  printf("Rate parameter alpha = %.2g\n\n", ALPH);
#endif
  printf("Mesh dimensions (mx,my) are %d, %d.  ", MX, MY);
  printf("Total system size is neq = %d \n\n", NEQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerances: reltol = %.2Lg, abstol = %.2Lg \n\n", RTOL, ATOL);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerances: reltol = %.2g, abstol = %.2g \n\n", RTOL, ATOL);
#else
  printf("Tolerances: reltol = %.2g, abstol = %.2g \n\n", RTOL, ATOL);
#endif
  printf("Preconditioning uses a product of:\n");
  printf("  (1) Gauss-Seidel iterations with ");
  printf("itmax = %d iterations, and\n", ITMAX);
  printf("  (2) interaction-only block-diagonal matrix ");
  printf("with block-grouping\n");
  printf("  Number of diagonal block groups = ngrp = %d", NGRP);
  printf("  (ngx by ngy, ngx = %d, ngy = %d)\n", NGX, NGY);
  printf("\n\n--------------------------------------------------------------");
  printf("--------------\n");
}